

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismModel::_prove_no_clique(HomomorphismModel *this,uint g,int p,int tt)

{
  int iVar1;
  bool bVar2;
  pointer pIVar3;
  reference pvVar4;
  size_type sVar5;
  undefined8 uVar6;
  NamedVertex *p_00;
  ProofError *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar7;
  CliqueResult result_1;
  CliqueParams params_1;
  uint t_1;
  uint f_1;
  InputGraph gv_1;
  int w_1;
  int count_1;
  vector<int,_std::allocator<int>_> invinclude_1;
  vector<int,_std::allocator<int>_> include_1;
  int *v;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  CliqueResult result;
  CliqueParams params;
  uint t;
  uint f;
  InputGraph gv;
  int w;
  int count;
  vector<int,_std::allocator<int>_> invinclude;
  vector<int,_std::allocator<int>_> include;
  uint decide_size;
  map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  t_clique_neighbourhood;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  p_clique;
  CliqueParams *in_stack_00000dd0;
  InputGraph *in_stack_00000dd8;
  value_type *in_stack_fffffffffffff928;
  CliqueParams *in_stack_fffffffffffff930;
  allocator_type *in_stack_fffffffffffff938;
  CliqueParams *in_stack_fffffffffffff940;
  vector<int,_std::allocator<int>_> *this_01;
  NamedVertex *in_stack_fffffffffffff948;
  SVOBitset *in_stack_fffffffffffff950;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff958;
  uint size;
  value_type in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  undefined8 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  int in_stack_fffffffffffff978;
  undefined2 uVar8;
  int in_stack_fffffffffffff97c;
  _Rb_tree_iterator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff990;
  int iVar9;
  HomomorphismModel *in_stack_fffffffffffff998;
  HomomorphismModel *this_02;
  byte local_520;
  vector<int,_std::allocator<int>_> local_518;
  pointer local_4f0;
  _Optional_payload_base<unsigned_int> local_4e8;
  undefined1 local_440;
  uint local_340;
  uint local_33c;
  NamedVertex *in_stack_fffffffffffffcf8;
  NamedVertex *in_stack_fffffffffffffd00;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd08;
  NamedVertex *in_stack_fffffffffffffd10;
  NamedVertex *in_stack_fffffffffffffd18;
  _Rb_tree_iterator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd20;
  int local_2a8;
  int local_2a4;
  undefined1 local_29d [32];
  allocator<int> local_27d;
  undefined4 local_27c;
  vector<int,_std::allocator<int>_> local_278 [2];
  reference local_238;
  _Self local_230;
  _Self local_228;
  undefined1 *local_220;
  undefined1 local_218 [112];
  undefined8 local_1a8;
  undefined8 local_190;
  uint local_d0;
  uint local_cc;
  int local_c0;
  int local_bc;
  allocator<int> local_b5;
  undefined4 local_b4;
  vector<int,_std::allocator<int>_> local_b0;
  allocator<int> local_85;
  undefined4 local_84;
  vector<int,_std::allocator<int>_> local_80;
  undefined4 local_64;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x144201);
  std::
  map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map((map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *)0x14420e);
  local_84 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x144241);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950,
             (size_type)in_stack_fffffffffffff948,(value_type_conflict1 *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::allocator<int>::~allocator(&local_85);
  local_b4 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1442a8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950,
             (size_type)in_stack_fffffffffffff948,(value_type_conflict1 *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::allocator<int>::~allocator(&local_b5);
  local_bc = 0;
  for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0xc); local_c0 = local_c0 + 1) {
    if (local_c0 != local_10) {
      pIVar3 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x14432b);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                (&pIVar3->pattern_graph_rows,
                 (ulong)(uint)(local_c0 * *(int *)(in_RDI + 8) + local_c));
      bVar2 = SVOBitset::test(in_stack_fffffffffffff950,
                              (int)((ulong)in_stack_fffffffffffff948 >> 0x20));
      iVar9 = local_bc;
      if (bVar2) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)local_c0);
        iVar1 = local_c0;
        *pvVar4 = iVar9;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)local_bc);
        *pvVar4 = iVar1;
        local_bc = local_bc + 1;
      }
    }
  }
  InputGraph::InputGraph
            ((InputGraph *)in_stack_fffffffffffff980._M_node,in_stack_fffffffffffff97c,
             SUB41((uint)in_stack_fffffffffffff978 >> 0x18,0),
             SUB41((uint)in_stack_fffffffffffff978 >> 0x10,0));
  for (local_cc = 0; local_cc < *(uint *)(in_RDI + 0xc); local_cc = local_cc + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(ulong)local_cc);
    if (*pvVar4 != -1) {
      for (local_d0 = 0; local_d0 < *(uint *)(in_RDI + 0xc); local_d0 = local_d0 + 1) {
        if ((local_cc != local_d0) &&
           (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(ulong)local_d0),
           *pvVar4 != -1)) {
          pIVar3 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x144526);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar3->pattern_graph_rows,(ulong)(local_cc * *(int *)(in_RDI + 8) + local_c))
          ;
          bVar2 = SVOBitset::test(in_stack_fffffffffffff950,
                                  (int)((ulong)in_stack_fffffffffffff948 >> 0x20));
          if (bVar2) {
            std::vector<int,_std::allocator<int>_>::operator[](&local_80,(ulong)local_cc);
            std::vector<int,_std::allocator<int>_>::operator[](&local_80,(ulong)local_d0);
            InputGraph::add_edge
                      ((InputGraph *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (int)((ulong)in_stack_fffffffffffff968 >> 0x20),
                       (int)in_stack_fffffffffffff968);
          }
        }
      }
    }
  }
  CliqueParams::CliqueParams(in_stack_fffffffffffff940);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x144635);
  std::shared_ptr<gss::Timeout>::operator=
            (&in_stack_fffffffffffff930->timeout,
             (shared_ptr<gss::Timeout> *)in_stack_fffffffffffff928);
  local_1a8 = std::chrono::_V2::steady_clock::now();
  local_190 = local_1a8;
  std::make_unique<gss::NoRestartsSchedule>();
  std::unique_ptr<gss::RestartsSchedule,std::default_delete<gss::RestartsSchedule>>::operator=
            ((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
             in_stack_fffffffffffff940,
             (unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_> *)
             in_stack_fffffffffffff938);
  std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
  ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_> *)
              in_stack_fffffffffffff930);
  solve_clique_problem(in_stack_00000dd8,in_stack_00000dd0);
  local_220 = local_218;
  local_228._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff928);
  local_230._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff928);
  while (bVar2 = std::operator==(&local_228,&local_230), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_238 = std::_Rb_tree_const_iterator<int>::operator*
                          ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff930);
    std::vector<int,_std::allocator<int>_>::operator[](&local_b0,(long)*local_238);
    pattern_vertex_for_proof_abi_cxx11_
              (in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20));
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x14477e);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff930);
  }
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1447fa);
  local_64 = (undefined4)sVar5;
  CliqueResult::~CliqueResult((CliqueResult *)in_stack_fffffffffffff930);
  CliqueParams::~CliqueParams(in_stack_fffffffffffff930);
  InputGraph::~InputGraph((InputGraph *)0x144825);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff940);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff940);
  local_27c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x144872);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950,
             (size_type)in_stack_fffffffffffff948,(value_type_conflict1 *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::allocator<int>::~allocator(&local_27d);
  uVar6 = 0;
  local_29d._1_4_ = 0;
  this_02 = (HomomorphismModel *)local_29d;
  std::allocator<int>::allocator((allocator<int> *)0x1448d3);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950,
             (size_type)in_stack_fffffffffffff948,(value_type_conflict1 *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::allocator<int>::~allocator((allocator<int> *)local_29d);
  local_2a4 = 0;
  for (local_2a8 = 0; uVar8 = (undefined2)((uint)in_stack_fffffffffffff978 >> 0x10),
      local_2a8 < *(int *)(in_RDI + 0x10); local_2a8 = local_2a8 + 1) {
    if (local_2a8 != local_14) {
      pIVar3 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x144950);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                (&pIVar3->target_graph_rows,
                 (ulong)(uint)(local_2a8 * *(int *)(in_RDI + 8) + local_c));
      bVar2 = SVOBitset::test(in_stack_fffffffffffff950,
                              (int)((ulong)in_stack_fffffffffffff948 >> 0x20));
      if (bVar2) {
        target_vertex_for_proof_abi_cxx11_(this_02,(int)((ulong)uVar6 >> 0x20));
        pVar7 = std::
                map<int,std::pair<int,std::__cxx11::string>,std::less<int>,std::allocator<std::pair<int_const,std::pair<int,std::__cxx11::string>>>>
                ::emplace<int&,std::pair<int,std::__cxx11::string>>
                          ((map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)in_stack_fffffffffffff940,(int *)in_stack_fffffffffffff938,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff930);
        in_stack_fffffffffffff980 = pVar7.first._M_node;
        in_stack_fffffffffffff97c = CONCAT13(pVar7.second,(int3)in_stack_fffffffffffff97c);
        in_stack_fffffffffffffd20._M_node = in_stack_fffffffffffff980._M_node;
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x144a09);
        in_stack_fffffffffffff974 = local_2a4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_278,(long)local_2a8);
        *pvVar4 = in_stack_fffffffffffff974;
        in_stack_fffffffffffff978 = local_2a8;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_29d + 5),(long)local_2a4);
        *pvVar4 = in_stack_fffffffffffff978;
        local_2a4 = local_2a4 + 1;
      }
    }
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x144b61);
  p_00 = (NamedVertex *)
         std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x144b6d);
  pattern_vertex_for_proof_abi_cxx11_(this_02,(int)((ulong)uVar6 >> 0x20));
  target_vertex_for_proof_abi_cxx11_(this_02,(int)((ulong)uVar6 >> 0x20));
  Proof::prepare_hom_clique_proof
            ((Proof *)in_stack_fffffffffffff950,in_stack_fffffffffffff948,
             (NamedVertex *)in_stack_fffffffffffff940,
             (uint)((ulong)in_stack_fffffffffffff938 >> 0x20));
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x144bde);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x144beb);
  InputGraph::InputGraph
            ((InputGraph *)in_stack_fffffffffffff980._M_node,in_stack_fffffffffffff97c,
             SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
  local_33c = 0;
  while( true ) {
    size = (uint)((ulong)in_stack_fffffffffffff958 >> 0x20);
    iVar9 = (int)((ulong)uVar6 >> 0x20);
    if (*(uint *)(in_RDI + 0x10) <= local_33c) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_278,(ulong)local_33c);
    if (*pvVar4 != -1) {
      for (local_340 = 0; local_340 < *(uint *)(in_RDI + 0x10); local_340 = local_340 + 1) {
        if ((local_33c != local_340) &&
           (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_278,(ulong)local_340),
           *pvVar4 != -1)) {
          pIVar3 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x144caa);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar3->target_graph_rows,(ulong)(local_33c * *(int *)(in_RDI + 8) + local_c))
          ;
          bVar2 = SVOBitset::test(in_stack_fffffffffffff950,
                                  (int)((ulong)in_stack_fffffffffffff948 >> 0x20));
          in_stack_fffffffffffff964 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff964);
          if (bVar2) {
            in_stack_fffffffffffff958 = local_278;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_fffffffffffff958,(ulong)local_33c);
            in_stack_fffffffffffff960 = *pvVar4;
            std::vector<int,_std::allocator<int>_>::operator[]
                      (in_stack_fffffffffffff958,(ulong)local_340);
            InputGraph::add_edge
                      ((InputGraph *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (int)((ulong)p_00 >> 0x20),(int)p_00);
          }
          else if (local_33c < local_340) {
            std::
            unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
            ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          *)0x144dc9);
            in_stack_fffffffffffff950 =
                 (SVOBitset *)
                 std::
                 __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x144dd5);
            pattern_vertex_for_proof_abi_cxx11_(this_02,(int)((ulong)uVar6 >> 0x20));
            target_vertex_for_proof_abi_cxx11_(this_02,(int)((ulong)uVar6 >> 0x20));
            target_vertex_for_proof_abi_cxx11_(this_02,(int)((ulong)uVar6 >> 0x20));
            target_vertex_for_proof_abi_cxx11_(this_02,(int)((ulong)uVar6 >> 0x20));
            Proof::add_hom_clique_non_edge
                      ((Proof *)in_stack_fffffffffffffd20._M_node,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00
                       ,in_stack_fffffffffffffcf8);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x144e93);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x144ea0);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x144ead);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x144eba);
          }
        }
      }
    }
    local_33c = local_33c + 1;
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x144f91);
  std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x144f9d);
  pattern_vertex_for_proof_abi_cxx11_(this_02,iVar9);
  target_vertex_for_proof_abi_cxx11_(this_02,iVar9);
  Proof::start_hom_clique_proof
            ((Proof *)params_1.connected._M_invoker,
             (NamedVertex *)params_1.connected.super__Function_base._M_manager,
             (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)params_1.connected.super__Function_base._M_functor._8_8_,
             (NamedVertex *)params_1.connected.super__Function_base._M_functor._M_unused._0_8_,
             (map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)params_1._56_8_);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x145017);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x145024);
  CliqueParams::CliqueParams(in_stack_fffffffffffff940);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x145040);
  std::shared_ptr<gss::Timeout>::operator=
            (&in_stack_fffffffffffff930->timeout,
             (shared_ptr<gss::Timeout> *)in_stack_fffffffffffff928);
  local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::chrono::_V2::steady_clock::now();
  local_4f0 = local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)std::make_optional<unsigned_int&>((uint *)in_stack_fffffffffffff928);
  local_4e8 = (_Optional_payload_base<unsigned_int>)
              local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  std::make_unique<gss::NoRestartsSchedule>();
  this_01 = &local_518;
  std::unique_ptr<gss::RestartsSchedule,std::default_delete<gss::RestartsSchedule>>::operator=
            ((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
             this_01,(unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                      *)in_stack_fffffffffffff938);
  std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
  ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_> *)
              in_stack_fffffffffffff930);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x1450d2);
  std::shared_ptr<gss::innards::Proof>::operator=
            ((shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffff930,
             (shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffff928);
  local_440 = 1;
  solve_clique_problem(in_stack_00000dd8,in_stack_00000dd0);
  if (((local_520 & 1) != 0) &&
     (bVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)0x145128), !bVar2)) {
    this_00 = (ProofError *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),(char *)p_00,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    ProofError::ProofError(this_00,(string *)in_stack_fffffffffffff928);
    __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x145279);
  std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x145285);
  pattern_vertex_for_proof_abi_cxx11_(this_02,iVar9);
  target_vertex_for_proof_abi_cxx11_(this_02,iVar9);
  Proof::finish_hom_clique_proof
            ((Proof *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),p_00,
             (NamedVertex *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),size);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x1452f4);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x145301);
  CliqueResult::~CliqueResult((CliqueResult *)in_stack_fffffffffffff930);
  CliqueParams::~CliqueParams(in_stack_fffffffffffff930);
  InputGraph::~InputGraph((InputGraph *)0x145328);
  std::vector<int,_std::allocator<int>_>::~vector(this_01);
  std::vector<int,_std::allocator<int>_>::~vector(this_01);
  std::
  map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~map((map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)0x14534f);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_01);
  return;
}

Assistant:

auto HomomorphismModel::_prove_no_clique(
    unsigned g,
    int p,
    int tt) const -> void
{
    vector<NamedVertex> p_clique;
    map<int, NamedVertex> t_clique_neighbourhood;
    unsigned decide_size;

    {
        vector<int> include(pattern_size, -1), invinclude(pattern_size, 0);
        int count = 0;
        for (int w = 0; w < int(pattern_size); ++w)
            if (w != p && _imp->pattern_graph_rows[w * max_graphs + g].test(p)) {
                include[w] = count;
                invinclude[count] = w;
                ++count;
            }

        InputGraph gv(count, false, false);
        for (unsigned f = 0; f < pattern_size; ++f)
            if (include[f] != -1)
                for (unsigned t = 0; t < pattern_size; ++t)
                    if (f != t && include[t] != -1 && _imp->pattern_graph_rows[f * max_graphs + g].test(t))
                        gv.add_edge(include[f], include[t]);

        CliqueParams params;
        params.timeout = _imp->params.timeout;
        params.start_time = steady_clock::now();
        params.restarts_schedule = make_unique<NoRestartsSchedule>();
        auto result = solve_clique_problem(gv, params);
        for (auto & v : result.clique)
            p_clique.push_back(pattern_vertex_for_proof(invinclude[v]));
        decide_size = result.clique.size();
    }

    {
        vector<int> include(target_size, -1), invinclude(target_size, 0);
        int count = 0;
        for (int w = 0; w < int(target_size); ++w)
            if (w != tt && _imp->target_graph_rows[w * max_graphs + g].test(tt)) {
                t_clique_neighbourhood.emplace(count, target_vertex_for_proof(w));
                include[w] = count;
                invinclude[count] = w;
                ++count;
            }

        _imp->proof->prepare_hom_clique_proof(pattern_vertex_for_proof(p), target_vertex_for_proof(tt), decide_size);

        InputGraph gv(count, false, false);
        for (unsigned f = 0; f < target_size; ++f)
            if (include[f] != -1)
                for (unsigned t = 0; t < target_size; ++t) {
                    if (f != t && include[t] != -1) {
                        if (_imp->target_graph_rows[f * max_graphs + g].test(t))
                            gv.add_edge(include[f], include[t]);
                        else if (f < t)
                            _imp->proof->add_hom_clique_non_edge(
                                pattern_vertex_for_proof(p), target_vertex_for_proof(tt),
                                p_clique, target_vertex_for_proof(f), target_vertex_for_proof(t));
                    }
                }

        _imp->proof->start_hom_clique_proof(pattern_vertex_for_proof(p), move(p_clique), target_vertex_for_proof(tt), move(t_clique_neighbourhood));

        CliqueParams params;
        params.timeout = _imp->params.timeout;
        params.start_time = steady_clock::now();
        params.decide = make_optional(decide_size);
        params.restarts_schedule = make_unique<NoRestartsSchedule>();
        params.extend_proof = _imp->proof;
        params.proof_is_for_hom = true;

        auto result = solve_clique_problem(gv, params);
        if (result.complete && ! result.clique.empty())
            throw ProofError{"Oops, found a clique that shound't exist"};
        _imp->proof->finish_hom_clique_proof(pattern_vertex_for_proof(p), target_vertex_for_proof(tt), decide_size);
    }
}